

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ViewPortTestCase::test(ViewPortTestCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint width_00;
  deInt32 dVar7;
  deInt32 dVar8;
  ContextInfo *pCVar9;
  RenderTarget *pRVar10;
  bool local_72;
  GLsizei height;
  GLsizei width;
  GLint y;
  GLint x;
  int i;
  int numIterations;
  float fStack_30;
  float fStack_2c;
  GLboolean hasViewportArray;
  GLfloat viewportBoundsRange [2];
  GLint maxViewportDimensions [2];
  Random rnd;
  ViewPortTestCase *this_local;
  
  de::Random::Random((Random *)maxViewportDimensions,0xabcdef);
  viewportBoundsRange[0] = 0.0;
  viewportBoundsRange[1] = 0.0;
  _fStack_30 = 0;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ApiCase).super_CallLogWrapper,0xd3a,(GLint *)viewportBoundsRange);
  pCVar9 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar9,"GL_OES_viewport_array");
  local_72 = true;
  if (!bVar3) {
    pCVar9 = gles2::Context::getContextInfo((this->super_ApiCase).super_TestCase.m_context);
    local_72 = glu::ContextInfo::isExtensionSupported(pCVar9,"GL_NV_viewport_array");
  }
  if (local_72 != false) {
    glu::CallLogWrapper::glGetFloatv(&(this->super_ApiCase).super_CallLogWrapper,0x825d,&fStack_30);
  }
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar10 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar4 = tcu::RenderTarget::getWidth(pRVar10);
  pRVar10 = gles2::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar5 = tcu::RenderTarget::getHeight(pRVar10);
  (*pSVar1->_vptr_StateVerifier[3])(pSVar1,pTVar2,0xba2,0,0,(ulong)uVar4,iVar5);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (y = 0; y < 0x78; y = y + 1) {
    uVar4 = de::Random::getInt((Random *)maxViewportDimensions,-64000,64000);
    uVar6 = de::Random::getInt((Random *)maxViewportDimensions,-64000,64000);
    width_00 = de::Random::getInt((Random *)maxViewportDimensions,0,(int)viewportBoundsRange[0]);
    iVar5 = de::Random::getInt((Random *)maxViewportDimensions,0,(int)viewportBoundsRange[1]);
    glu::CallLogWrapper::glViewport
              (&(this->super_ApiCase).super_CallLogWrapper,uVar4,uVar6,width_00,iVar5);
    if (local_72 == false) {
      (*this->m_verifier->_vptr_StateVerifier[3])
                (this->m_verifier,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xba2,
                 (ulong)uVar4,(ulong)uVar6,(ulong)width_00,iVar5);
    }
    else {
      pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      pSVar1 = this->m_verifier;
      dVar7 = ::deFloorFloatToInt32(fStack_30);
      dVar8 = ::deFloorFloatToInt32(fStack_2c);
      uVar4 = de::clamp<int>(uVar4,dVar7,dVar8);
      dVar7 = ::deFloorFloatToInt32(fStack_30);
      dVar8 = ::deFloorFloatToInt32(fStack_2c);
      uVar6 = de::clamp<int>(uVar6,dVar7,dVar8);
      (*pSVar1->_vptr_StateVerifier[3])
                (pSVar1,pTVar2,0xba2,(ulong)uVar4,(ulong)uVar6,(ulong)width_00,iVar5);
    }
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)maxViewportDimensions);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLint maxViewportDimensions[2] = {0};
		GLfloat viewportBoundsRange[2] = {0.0f};
		GLboolean hasViewportArray = false;
		glGetIntegerv(GL_MAX_VIEWPORT_DIMS, maxViewportDimensions);
		hasViewportArray = m_context.getContextInfo().isExtensionSupported("GL_OES_viewport_array") ||
						   m_context.getContextInfo().isExtensionSupported("GL_NV_viewport_array");
		if (hasViewportArray)
		{
			glGetFloatv(GL_VIEWPORT_BOUNDS_RANGE, viewportBoundsRange);
		}

		// verify initial value of first two values
		m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint x			= rnd.getInt(-64000, 64000);
			GLint y			= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, maxViewportDimensions[0]);
			GLsizei height	= rnd.getInt(0, maxViewportDimensions[1]);

			glViewport(x, y, width, height);

			if (hasViewportArray)
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT,
										   de::clamp(x, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   de::clamp(y, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   width, height);
			}
			else
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, x, y, width, height);
			}

			expectError(GL_NO_ERROR);
		}
	}